

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FIReader.cpp
# Opt level: O2

void __thiscall Assimp::FIIntValueImpl::~FIIntValueImpl(FIIntValueImpl *this)

{
  ~FIIntValueImpl(this);
  operator_delete(this);
  return;
}

Assistant:

inline FIIntValueImpl(std::vector<int32_t> &&value_): strValueValid(false) { value = std::move(value_); }